

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

OptionContext * __thiscall
Potassco::ProgramOptions::OptionContext::add(OptionContext *this,OptionGroup *options)

{
  DescriptionLevel DVar1;
  pointer pIVar2;
  pointer pOVar3;
  size_t groupId;
  DescriptionLevel DVar4;
  pointer opt;
  ulong uVar5;
  OptionGroup OStack_68;
  
  groupId = findGroupKey(this,&options->caption_);
  uVar5 = (long)(this->groups_).
                super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->groups_).
                super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  if (uVar5 <= groupId) {
    OptionGroup::OptionGroup(&OStack_68,&options->caption_,options->level_);
    std::
    vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
    ::emplace_back<Potassco::ProgramOptions::OptionGroup>(&this->groups_,&OStack_68);
    OptionGroup::~OptionGroup(&OStack_68);
    groupId = uVar5;
  }
  pIVar2 = (options->options_).
           super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (opt = (options->options_).
             super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
             ._M_impl.super__Vector_impl_data._M_start; opt != pIVar2; opt = opt + 1) {
    insertOption(this,groupId,opt);
  }
  pOVar3 = (this->groups_).
           super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  DVar1 = pOVar3[groupId].level_;
  DVar4 = options->level_;
  if ((int)DVar1 < (int)options->level_) {
    DVar4 = DVar1;
  }
  pOVar3[groupId].level_ = DVar4;
  return this;
}

Assistant:

OptionContext& OptionContext::add(const OptionGroup& options) {
	size_t k = findGroupKey(options.caption());
	if (k >= groups_.size()) {
		// add as new group
		k = groups_.size();
		groups_.push_back(OptionGroup(options.caption(), options.descLevel()));
	}
	for (option_iterator it = options.begin(), end = options.end(); it != end; ++it) {
		insertOption(k, *it);
	}
	groups_[k].setDescriptionLevel(std::min(options.descLevel(), groups_[k].descLevel()));
	return *this;
}